

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerType.cpp
# Opt level: O3

void __thiscall hdc::PointerType::PointerType(PointerType *this,Type *type)

{
  ASTNode::ASTNode((ASTNode *)this);
  (this->super_Type).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00196960;
  (this->token).lexem._M_dataplus._M_p = (pointer)&(this->token).lexem.field_2;
  (this->token).lexem._M_string_length = 0;
  (this->token).lexem.field_2._M_local_buf[0] = '\0';
  this->subtype = type;
  (this->super_Type).super_ASTNode.kind = AST_POINTER_TYPE;
  ASTNode::setParentNode(&type->super_ASTNode,(ASTNode *)this);
  return;
}

Assistant:

PointerType::PointerType(Type* type) {
    this->subtype = type;
    this->kind = AST_POINTER_TYPE;
    type->setParentNode(this);
}